

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_utxo.cpp
# Opt level: O1

void cfd::CoinSelection::ConvertToUtxo
               (Txid *txid,uint32_t vout,string *output_descriptor,Amount *amount,string *asset,
               void *binary_data,Utxo *utxo,Script *scriptsig_template)

{
  CfdException *this;
  UtxoData utxo_data;
  ConfidentialAssetId local_548;
  undefined1 local_520 [600];
  int64_t local_2c8;
  bool local_2c0;
  AddressType local_2b8;
  void *local_2b0;
  ConfidentialAssetId local_2a8 [14];
  Script local_68;
  
  if (utxo != (Utxo *)0x0) {
    memset(utxo,0,0xd8);
    UtxoData::UtxoData((UtxoData *)local_520);
    core::Txid::operator=((Txid *)(local_520 + 0x28),txid);
    local_520._72_4_ = vout;
    std::__cxx11::string::_M_assign((string *)(local_520 + 0x238));
    local_2c0 = amount->ignore_check_;
    local_2c8 = amount->amount_;
    local_2b8 = kP2wpkhAddress;
    if (scriptsig_template != (Script *)0x0) {
      core::Script::operator=(&local_68,scriptsig_template);
    }
    local_2b0 = binary_data;
    if (asset->_M_string_length != 0) {
      core::ConfidentialAssetId::ConfidentialAssetId(&local_548,asset);
      core::ConfidentialAssetId::operator=(local_2a8,&local_548);
      local_548._vptr_ConfidentialAssetId = (_func_int **)&PTR__ConfidentialAssetId_00735710;
      if (local_548.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
        operator_delete(local_548.data_.data_.
                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
    }
    UtxoUtil::ConvertToUtxo((UtxoData *)local_520,utxo,(UtxoData *)0x0);
    UtxoData::~UtxoData((UtxoData *)local_520);
    return;
  }
  local_520._0_8_ = "cfd_utxo.cpp";
  local_520._8_4_ = 0x3aa;
  local_520._16_8_ = "ConvertToUtxo";
  core::logger::log<>((CfdSourceLocation *)local_520,kCfdLogLevelWarning,"utxo is nullptr.");
  this = (CfdException *)__cxa_allocate_exception(0x30);
  local_520._0_8_ = local_520 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_520,"Failed to convert utxo. utxo is nullptr.","");
  core::CfdException::CfdException(this,kCfdIllegalArgumentError,(string *)local_520);
  __cxa_throw(this,&core::CfdException::typeinfo,core::CfdException::~CfdException);
}

Assistant:

void CoinSelection::ConvertToUtxo(
    const Txid& txid, uint32_t vout, const std::string& output_descriptor,
    const Amount& amount, const std::string& asset, const void* binary_data,
    Utxo* utxo, const Script* scriptsig_template) {
  if (utxo == nullptr) {
    warn(CFD_LOG_SOURCE, "utxo is nullptr.");
    throw CfdException(
        CfdError::kCfdIllegalArgumentError,
        "Failed to convert utxo. utxo is nullptr.");
  }
  memset(utxo, 0, sizeof(*utxo));

  UtxoData utxo_data;
  utxo_data.txid = txid;
  utxo_data.vout = vout;
  utxo_data.descriptor = output_descriptor;
  utxo_data.amount = amount;
  utxo_data.address_type = AddressType::kP2wpkhAddress;  // initialize
  if (scriptsig_template != nullptr) {
    utxo_data.scriptsig_template = *scriptsig_template;
  }
  memcpy(&utxo_data.binary_data, &binary_data, sizeof(void*));
#ifndef CFD_DISABLE_ELEMENTS
  if (!asset.empty()) {
    utxo_data.asset = ConfidentialAssetId(asset);
  }
#endif  // CFD_DISABLE_ELEMENTS
  UtxoUtil::ConvertToUtxo(utxo_data, utxo, nullptr);
}